

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_concat.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::StructConcatBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  bool bVar1;
  LogicalTypeId LVar2;
  __type _Var3;
  size_type sVar4;
  pointer this;
  undefined8 uVar5;
  pointer params;
  ulong uVar6;
  reference pbVar7;
  string *msg;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_RCX;
  string *in_RDI;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar8;
  iterator it;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *child;
  const_iterator __end2;
  const_iterator __begin2;
  child_list_t<LogicalType> *__range2;
  child_list_t<LogicalType> *child_types;
  value_type *arg;
  idx_t arg_idx;
  bool has_unnamed;
  case_insensitive_set_t name_set;
  child_list_t<LogicalType> combined_children;
  string *in_stack_fffffffffffffd08;
  LogicalType *in_stack_fffffffffffffd10;
  allocator *paVar9;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  unsigned_long in_stack_fffffffffffffd40;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  in_stack_fffffffffffffd48;
  child_list_t<LogicalType> *in_stack_fffffffffffffd50;
  pointer in_stack_fffffffffffffd58;
  string *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this_00;
  allocator local_211;
  string local_210 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1f0;
  undefined1 local_1e8;
  undefined1 local_1d9;
  string local_1d8 [32];
  string local_1b8 [39];
  allocator local_191;
  string local_190 [39];
  undefined1 local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_120;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_118;
  reference local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *local_108;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
  local_100;
  child_list_t<LogicalType> *local_f8;
  child_list_t<LogicalType> *local_f0;
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [32];
  reference local_c0;
  ulong local_b8;
  byte local_a9;
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *local_20;
  
  this_00._M_head_impl = (FunctionData *)in_RDI;
  local_20 = in_RCX;
  bVar1 = std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::empty((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)in_stack_fffffffffffffd20._M_cur);
  if (bVar1) {
    local_55 = 1;
    uVar5 = __cxa_allocate_exception(0x10);
    paVar9 = &local_41;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_40,"struct_concat: At least one argument is required",paVar9);
    InvalidInputException::InvalidInputException
              ((InvalidInputException *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    local_55 = 0;
    __cxa_throw(uVar5,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException
               );
  }
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)0x13ce7bb);
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x13ce7c8);
  local_a9 = 0;
  local_b8 = 0;
  while( true ) {
    uVar6 = local_b8;
    sVar4 = ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::size(local_20);
    if (sVar4 <= uVar6) {
      if ((local_a9 & 1) != 0) {
        bVar1 = ::std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x13cee4b);
        if (!bVar1) {
          msg = (string *)__cxa_allocate_exception(0x10);
          paVar9 = &local_211;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_210,"struct_concat: Cannot mix named and unnamed STRUCTs",paVar9);
          InvalidInputException::InvalidInputException((InvalidInputException *)paVar9,msg);
          __cxa_throw(msg,&InvalidInputException::typeinfo,
                      InvalidInputException::~InvalidInputException);
        }
      }
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                *)in_stack_fffffffffffffd10,
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                *)in_stack_fffffffffffffd08);
      LogicalType::STRUCT((child_list_t<LogicalType> *)in_stack_fffffffffffffd58);
      LogicalType::operator=(in_stack_fffffffffffffd10,(LogicalType *)in_stack_fffffffffffffd08);
      LogicalType::~LogicalType((LogicalType *)0x13cef82);
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                 *)0x13cef8f);
      unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
      unique_ptr<std::default_delete<duckdb::FunctionData>,void>
                ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      ::std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x13cefad);
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                 *)0x13cefba);
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
             this_00._M_head_impl;
    }
    local_c0 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)in_stack_fffffffffffffd10,(size_type)in_stack_fffffffffffffd08);
    this = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffd10);
    LVar2 = LogicalType::id(&this->return_type);
    if (LVar2 == UNKNOWN) break;
    params = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffd10);
    LVar2 = LogicalType::id(&params->return_type);
    if (LVar2 != STRUCT) {
      local_e2 = 1;
      uVar5 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_e0,"struct_concat: Argument at position \"%d\" is not a STRUCT",&local_e1);
      InvalidInputException::InvalidInputException<unsigned_long>
                ((InvalidInputException *)in_stack_fffffffffffffd50,
                 (string *)in_stack_fffffffffffffd48._M_cur,in_stack_fffffffffffffd40);
      local_e2 = 0;
      __cxa_throw(uVar5,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    }
    in_stack_fffffffffffffd58 =
         unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                   ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *
                    )in_stack_fffffffffffffd10);
    in_stack_fffffffffffffd50 = StructType::GetChildTypes_abi_cxx11_(in_stack_fffffffffffffd10);
    local_f8 = in_stack_fffffffffffffd50;
    local_f0 = in_stack_fffffffffffffd50;
    local_100._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
          *)::std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                     *)in_stack_fffffffffffffd08);
    local_108 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                 *)::std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                          *)in_stack_fffffffffffffd08);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                          *)in_stack_fffffffffffffd10,
                         (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                          *)in_stack_fffffffffffffd08);
      if (!bVar1) break;
      local_110 = __gnu_cxx::
                  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                  ::operator*(&local_100);
      uVar6 = ::std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        in_stack_fffffffffffffd48._M_cur =
             (__node_type *)
             ::std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffd08,(key_type *)0x13ceab5);
        local_118._M_cur = in_stack_fffffffffffffd48._M_cur;
        local_120._M_cur =
             (__node_type *)
             ::std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffd08);
        bVar1 = ::std::__detail::operator!=(&local_118,&local_120);
        if (bVar1) {
          std::__detail::
          _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
          ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                       *)0x13ceb09);
          _Var3 = ::std::operator==(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
          if (!_Var3) {
            local_1d9 = 1;
            uVar5 = __cxa_allocate_exception(0x10);
            paVar9 = &local_191;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_190,
                       "struct_concat: Arguments contain case-insensitive duplicate STRUCT entry \"%s\" and \"%s\""
                       ,paVar9);
            ::std::__cxx11::string::string(local_1b8,(string *)local_110);
            pbVar7 = std::__detail::
                     _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                     ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                                  *)0x13ceca8);
            ::std::__cxx11::string::string(local_1d8,(string *)pbVar7);
            InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                      ((InvalidInputException *)this_00._M_head_impl,in_RDI,
                       in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
            local_1d9 = 0;
            __cxa_throw(uVar5,&InvalidInputException::typeinfo,
                        InvalidInputException::~InvalidInputException);
          }
          local_169 = 1;
          uVar5 = __cxa_allocate_exception(0x10);
          paVar9 = &local_141;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_140,"struct_concat: Arguments contain duplicate STRUCT entry \"%s\"",
                     paVar9);
          ::std::__cxx11::string::string(local_168,(string *)local_110);
          InvalidInputException::InvalidInputException<std::__cxx11::string>
                    ((InvalidInputException *)this,in_stack_fffffffffffffd78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params);
          local_169 = 0;
          __cxa_throw(uVar5,&InvalidInputException::typeinfo,
                      InvalidInputException::~InvalidInputException);
        }
        pVar8 = ::std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffd20._M_cur,
                         (value_type *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18)
                        );
        in_stack_fffffffffffffd20._M_cur =
             (__node_type *)
             pVar8.first.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur;
        in_stack_fffffffffffffd1f = pVar8.second;
        local_1f0._M_cur = in_stack_fffffffffffffd20._M_cur;
        local_1e8 = in_stack_fffffffffffffd1f;
      }
      else {
        local_a9 = 1;
      }
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)in_stack_fffffffffffffd20._M_cur,
                  (value_type *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
      __gnu_cxx::
      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
      ::operator++(&local_100);
    }
    local_b8 = local_b8 + 1;
  }
  uVar5 = __cxa_allocate_exception(0x10);
  ParameterNotResolvedException::ParameterNotResolvedException
            ((ParameterNotResolvedException *)in_stack_fffffffffffffd50);
  __cxa_throw(uVar5,&ParameterNotResolvedException::typeinfo,
              ParameterNotResolvedException::~ParameterNotResolvedException);
}

Assistant:

static unique_ptr<FunctionData> StructConcatBind(ClientContext &context, ScalarFunction &bound_function,
                                                 vector<unique_ptr<Expression>> &arguments) {

	// collect names and deconflict, construct return type
	if (arguments.empty()) {
		throw InvalidInputException("struct_concat: At least one argument is required");
	}

	child_list_t<LogicalType> combined_children;
	case_insensitive_set_t name_set;

	bool has_unnamed = false;

	for (idx_t arg_idx = 0; arg_idx < arguments.size(); arg_idx++) {
		const auto &arg = arguments[arg_idx];

		if (arg->return_type.id() == LogicalTypeId::UNKNOWN) {
			throw ParameterNotResolvedException();
		}

		if (arg->return_type.id() != LogicalTypeId::STRUCT) {
			throw InvalidInputException("struct_concat: Argument at position \"%d\" is not a STRUCT", arg_idx + 1);
		}

		const auto &child_types = StructType::GetChildTypes(arg->return_type);
		for (const auto &child : child_types) {
			if (!child.first.empty()) {
				auto it = name_set.find(child.first);
				if (it != name_set.end()) {
					if (*it == child.first) {
						throw InvalidInputException("struct_concat: Arguments contain duplicate STRUCT entry \"%s\"",
						                            child.first);
					}
					throw InvalidInputException(
					    "struct_concat: Arguments contain case-insensitive duplicate STRUCT entry \"%s\" and \"%s\"",
					    child.first, *it);
				}
				name_set.insert(child.first);
			} else {
				has_unnamed = true;
			}
			combined_children.push_back(child);
		}
	}

	if (has_unnamed && !name_set.empty()) {
		throw InvalidInputException("struct_concat: Cannot mix named and unnamed STRUCTs");
	}

	bound_function.return_type = LogicalType::STRUCT(combined_children);
	return nullptr;
}